

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O2

void __thiscall
cfd::core::TaprootScriptTree::TaprootScriptTree(TaprootScriptTree *this,TapBranch *leaf_branch)

{
  allocator leaf_version;
  bool bVar1;
  CfdException *pCVar2;
  allocator local_61;
  undefined1 local_60 [56];
  
  TapBranch::TapBranch(&this->super_TapBranch,leaf_branch);
  (this->super_TapBranch)._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006549e0;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (leaf_branch->has_leaf_ == false) {
    local_60._0_8_ = "cfdcore_taproot.cpp";
    local_60._8_4_ = 0x1d8;
    local_60._16_8_ = (long)"CfdInitializeTaprootScriptTree" + 0xd;
    logger::warn<>((CfdSourceLocation *)local_60,"object is not tapleaf.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)local_60,"object is not tapleaf.",&local_61);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_60);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  leaf_version = (allocator)leaf_branch->leaf_version_;
  bVar1 = TaprootUtil::IsValidLeafVersion((uint8_t)leaf_version);
  if (bVar1) {
    (this->super_TapBranch).has_leaf_ = true;
    (this->super_TapBranch).leaf_version_ = (uint8_t)leaf_version;
    Script::Script((Script *)local_60,&leaf_branch->script_);
    Script::operator=(&(this->super_TapBranch).script_,(Script *)local_60);
    Script::~Script((Script *)local_60);
    ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::vector
              ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)local_60,
               &leaf_branch->branch_list_);
    ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::_M_move_assign
              (&(this->super_TapBranch).branch_list_,
               (vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)local_60);
    ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
              ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)local_60);
    (*leaf_branch->_vptr_TapBranch[4])(local_60,leaf_branch);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::_M_move_assign
              (&this->nodes_,
               (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_60);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_60);
    return;
  }
  local_60._0_8_ = "cfdcore_taproot.cpp";
  local_60._8_4_ = 0x1de;
  local_60._16_8_ = (long)"CfdInitializeTaprootScriptTree" + 0xd;
  local_61 = leaf_version;
  logger::warn<unsigned_char>
            ((CfdSourceLocation *)local_60,"Unsupported leaf version. [{}]",(uchar *)&local_61);
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_60,"Unsupported leaf version.",&local_61);
  CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_60);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

TaprootScriptTree::TaprootScriptTree(const TapBranch& leaf_branch)
    : TapBranch(leaf_branch) {
  if (!leaf_branch.HasTapLeaf()) {
    warn(CFD_LOG_SOURCE, "object is not tapleaf.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "object is not tapleaf.");
  }
  if (!TaprootUtil::IsValidLeafVersion(leaf_branch.GetLeafVersion())) {
    warn(
        CFD_LOG_SOURCE, "Unsupported leaf version. [{}]",
        leaf_branch.GetLeafVersion());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unsupported leaf version.");
  }
  has_leaf_ = true;
  leaf_version_ = leaf_branch.GetLeafVersion();
  script_ = leaf_branch.GetScript();
  branch_list_ = leaf_branch.GetBranchList();
  nodes_ = leaf_branch.GetNodeList();
}